

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O3

void * Memory::StandAloneFreeListPolicy::Allocate(void *policy,size_t size)

{
  int iVar1;
  undefined4 uVar2;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  void *pvVar7;
  long lVar8;
  
  if (policy == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                       ,0x36f,"(policy)","policy");
    if (!bVar5) goto LAB_006937f7;
    *puVar6 = 0;
  }
  iVar1 = *(int *)(*(long *)((long)policy + 0x10) + -4 + (size >> 4) * 4);
  if (iVar1 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    lVar3 = *(long *)((long)policy + 0x18);
    lVar8 = (ulong)(iVar1 - 1) * 0x10;
    uVar2 = *(undefined4 *)((long)policy + 8);
    *(int *)((long)policy + 8) = iVar1;
    *(undefined4 *)(*(long *)((long)policy + 0x10) + -4 + (size >> 4) * 4) =
         *(undefined4 *)(lVar3 + 8 + lVar8);
    pvVar7 = *(void **)(lVar3 + lVar8);
    if (pvVar7 == (void *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                         ,0x37e,"(object != 0)","object != NULL");
      if (!bVar5) {
LAB_006937f7:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    *(undefined4 *)((undefined8 *)(lVar3 + lVar8) + 1) = uVar2;
    *(undefined8 *)(lVar3 + lVar8) = 0;
  }
  return pvVar7;
}

Assistant:

void * StandAloneFreeListPolicy::Allocate(void * policy, size_t size)
{
    Assert(policy);

    StandAloneFreeListPolicy * _this = reinterpret_cast<StandAloneFreeListPolicy *>(policy);
    size_t index = (size >> ArenaAllocator::ObjectAlignmentBitShift) - 1;
    void * object = NULL;

    uint * freeObjectList = &_this->freeObjectLists[index];
    if (0 != *freeObjectList)
    {
        FreeObjectListEntry * entry = &_this->entries[*freeObjectList - 1];
        uint oldFreeList = _this->freeList;

        _this->freeList = *freeObjectList;
        *freeObjectList = entry->next;
        object = entry->object;
        Assert(object != NULL);
        entry->next = oldFreeList;
        entry->object = NULL;
    }

    return object;
}